

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

void __thiscall
docopt::BranchPattern::fix_identities(BranchPattern *this,UniquePatternSet *patterns)

{
  __shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long *plVar2;
  shared_ptr<docopt::Pattern> *child;
  __shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *this_00;
  __ireturn_type _Var3;
  
  p_Var1 = &((this->fChildren).
             super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>;
  for (this_00 = &((this->fChildren).
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>; this_00 != p_Var1
      ; this_00 = this_00 + 1) {
    if (this_00->_M_ptr != (element_type *)0x0) {
      plVar2 = (long *)__dynamic_cast(this_00->_M_ptr,&Pattern::typeinfo,&typeinfo,0);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x48))(plVar2,patterns);
      }
    }
    _Var3 = std::__detail::
            _Insert_base<std::shared_ptr<docopt::Pattern>,_std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>,_std::__detail::_Identity,_docopt::PatternPointerEquality,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::insert((_Insert_base<std::shared_ptr<docopt::Pattern>,_std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>,_std::__detail::_Identity,_docopt::PatternPointerEquality,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)patterns,(value_type *)this_00);
    if (((undefined1  [16])_Var3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>::operator=
                (this_00,(__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)
                         ((long)_Var3.first.
                                super__Node_iterator_base<std::shared_ptr<docopt::Pattern>,_true>.
                                _M_cur.
                                super__Node_iterator_base<std::shared_ptr<docopt::Pattern>,_true> +
                         8));
    }
  }
  return;
}

Assistant:

virtual void fix_identities(UniquePatternSet& patterns) {
			for(auto& child : fChildren) {
				// this will fix up all its children, if needed
				if (auto bp = dynamic_cast<BranchPattern*>(child.get())) {
					bp->fix_identities(patterns);
				}

				// then we try to add it to the list
				auto inserted = patterns.insert(child);
				if (!inserted.second) {
					// already there? then reuse the existing shared_ptr for that thing
					child = *inserted.first;
				}
			}
		}